

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *samplings;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool *pbVar2;
  bool *pbVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  ostringstream *poVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_4>_> *pVVar11;
  pointer pcVar12;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar13;
  double dVar14;
  pointer pVVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  _Rb_tree_node_base *p_Var19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  undefined8 *puVar23;
  long lVar24;
  Interval *pIVar25;
  Vector<float,_4> *pVVar26;
  int row;
  double dVar27;
  TestStatus *pTVar28;
  long lVar29;
  _Base_ptr p_Var30;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>
  *pBVar31;
  Interval *__return_storage_ptr___00;
  byte bVar32;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  IVal reference0;
  ResultCollector status;
  _Alloc_hider in_stack_fffffffffffffa78;
  _Alloc_hider _Var33;
  size_type sStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>
  *local_568;
  IVal local_559;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_558;
  FloatFormat *local_550;
  size_t local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [24];
  double local_518;
  double local_4e0;
  TestStatus *local_4d8;
  string local_4d0;
  double local_4b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4a8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>
  local_478;
  undefined1 local_448 [16];
  double local_438;
  double dStack_430;
  double local_428;
  pointer local_418;
  pointer local_410;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_408;
  pointer local_3a8;
  pointer local_3a0;
  pointer local_398;
  pointer local_390;
  undefined1 local_388 [8];
  Sampling<tcu::Vector<float,_4>_> *pSStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  double local_368;
  Precision local_360;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_358;
  undefined4 local_350;
  ios_base local_318 [8];
  ios_base local_310 [272];
  undefined1 local_200 [16];
  _Base_ptr local_1f0 [12];
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar32 = 0;
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_4d8 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_550 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_408,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)SUB84(in_stack_fffffffffffffa78._M_p,0));
  pVVar15 = local_408.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_548 = (long)local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_478,local_548);
  local_428 = (this->m_caseCtx).highpFormat.m_maxValue;
  local_448._0_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat;
  local_448._8_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_fractionBits;
  local_438 = *(double *)&(this->m_caseCtx).highpFormat.m_hasInf;
  dStack_430 = *(double *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4a8._M_impl.super__Rb_tree_header._M_header;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4a8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_558 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_3a8 = local_408.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_3a0 = local_408.in1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_398 = local_408.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_390 = local_408.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_418 = local_478.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_410 = local_478.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar6 = (ostringstream *)(local_200 + 8);
  local_568 = this;
  local_200._0_8_ = local_558;
  std::__cxx11::ostringstream::ostringstream(poVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar6,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar6);
  std::ios_base::~ios_base(local_188);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
  p_Var5 = (_Rb_tree_node_base *)(local_540 + 8);
  local_540._8_4_ = _S_red;
  local_530._0_8_ = (_Base_ptr)0x0;
  local_518 = 0.0;
  pSVar9 = (local_568->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._8_8_ = p_Var5;
  local_530._16_8_ = p_Var5;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_540);
  if ((_Rb_tree_node_base *)local_530._8_8_ != p_Var5) {
    p_Var19 = (_Rb_tree_node_base *)local_530._8_8_;
    do {
      (**(code **)(**(long **)(p_Var19 + 1) + 0x30))(*(long **)(p_Var19 + 1),local_388);
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != p_Var5);
  }
  if (local_518 != 0.0) {
    poVar6 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar6,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar6,in_stack_fffffffffffffa78._M_p,sStack_580);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa78._M_p != &local_578) {
      operator_delete(in_stack_fffffffffffffa78._M_p,local_578._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar6);
    std::ios_base::~ios_base(local_188);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
  std::ios_base::~ios_base(local_318);
  pBVar31 = local_568;
  pSVar10 = (local_568->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_548,&local_3a8,&local_418,0);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_390 + lVar20) = 0;
    *(undefined8 *)(local_388 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pSStack_380 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_390 + lVar20) = 0;
    *(undefined8 *)(local_388 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pSStack_380 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_548 + lVar20) = 0;
    *(undefined8 *)(local_540 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_548 + lVar20) = 0;
    *(undefined8 *)(local_540 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_200);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a8,
             (pBVar31->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_388);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a8,
             (pBVar31->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a8,
             (pBVar31->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa78);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a8,
             (pBVar31->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d0);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_4a8,
             (pBVar31->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_200);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a8,
             (pBVar31->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_559);
  if (local_408.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar15) {
LAB_00951085:
    poVar6 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"All ",4);
    pTVar28 = local_4d8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar6);
    std::ios_base::~ios_base(local_188);
    local_200._0_8_ = (IVal *)local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_200._0_8_,
               (long)&((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)local_200._0_8_)->m_data[0].
                      m_data[0].m_hasNaN + local_200._8_8_);
    pIVar22 = (IVal *)local_200._0_8_;
    if ((IVal *)local_200._0_8_ == (IVal *)local_1f0) goto LAB_0095125b;
  }
  else {
    local_4b0 = (double)(local_548 + (local_548 == 0));
    dVar27 = 0.0;
    local_4e0 = 0.0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_200);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,local_550,(Vector<float,_4> *)&stack0xfffffffffffffa78);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_388,local_550,(IVal *)local_540);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a8,
                           (pBVar31->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar23 = (undefined8 *)local_388;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar23;
        puVar23 = puVar23 + (ulong)bVar32 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      _Var33._M_p = *(pointer *)
                     local_408.in1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar27].m_data;
      lVar20 = *(long *)(local_408.in1.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)dVar27].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,local_550,(Vector<float,_4> *)&stack0xfffffffffffffa78);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_388,local_550,(IVal *)local_540);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a8,
                           (pBVar31->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar23 = (undefined8 *)local_388;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar23;
        puVar23 = puVar23 + (ulong)bVar32 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4a8,
                 (pBVar31->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4a8,
                 (pBVar31->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_360 = (pBVar31->m_caseCtx).precision;
      local_368 = local_550->m_maxValue;
      local_388 = *(undefined1 (*) [8])local_550;
      pSStack_380 = *(Sampling<tcu::Vector<float,_4>_> **)&local_550->m_fractionBits;
      local_378._M_allocated_capacity = *(undefined8 *)&local_550->m_hasInf;
      local_378._8_1_ = local_550->m_exactPrecision;
      local_378._9_3_ = *(undefined3 *)&local_550->field_0x19;
      local_378._12_4_ = *(undefined4 *)&local_550->field_0x1c;
      local_350 = 0;
      pSVar9 = (pBVar31->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_358 = &local_4a8;
      (*pSVar9->_vptr_Statement[3])(pSVar9,local_388);
      pIVar22 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_4a8,
                           (pBVar31->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      __return_storage_ptr___00 = (Interval *)local_388;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,(FloatFormat *)local_448,pIVar22);
      lVar24 = 0;
      pIVar25 = (Interval *)local_200;
      do {
        lVar29 = 0;
        do {
          *(undefined8 *)((long)&pIVar25->m_hi + lVar29) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar29);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar29;
          dVar14 = *(double *)(pbVar2 + 8);
          pbVar3 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar25->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar29;
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar2;
          *(double *)(pbVar3 + 8) = dVar14;
          lVar29 = lVar29 + 0x60;
        } while (lVar29 != 0x180);
        lVar24 = lVar24 + 1;
        pIVar25 = pIVar25 + 1;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar24 != 4);
      bVar16 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_200,
                          local_478.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)dVar27);
      local_388 = (undefined1  [8])&local_378;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_388,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_80,bVar16,(string *)local_388);
      if (local_388 != (undefined1  [8])&local_378) {
        operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
      }
      if (!bVar16) {
        uVar18 = SUB84(local_4e0,0) + 1;
        local_4e0 = (double)(ulong)uVar18;
        if ((int)uVar18 < 0x65) {
          local_388 = (undefined1  [8])local_558;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_380);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\t",1);
          pVVar11 = (local_568->m_variables).in0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                    m_ptr;
          pVVar26 = (Vector<float,_4> *)local_530;
          pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
          local_540._0_8_ = pVVar26;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,(char *)local_540._0_8_,
                     CONCAT44(local_540._12_4_,local_540._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)local_448,
                     (FloatFormat *)
                     (local_408.in0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar27),pVVar26);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,_Var33._M_p,lVar20);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var33._M_p != &local_578) {
            operator_delete(_Var33._M_p,local_578._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_540._0_8_ != (Vector<float,_4> *)local_530) {
            operator_delete((void *)local_540._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\t",1);
          pVVar11 = (local_568->m_variables).in1.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                    m_ptr;
          pVVar26 = (Vector<float,_4> *)local_530;
          pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
          local_540._0_8_ = pVVar26;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,(char *)local_540._0_8_,
                     CONCAT44(local_540._12_4_,local_540._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)local_448,
                     (FloatFormat *)
                     (local_408.in1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar27),pVVar26);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,_Var33._M_p,lVar20);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var33._M_p != &local_578) {
            operator_delete(_Var33._M_p,local_578._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_540._0_8_ != (Vector<float,_4> *)local_530) {
            operator_delete((void *)local_540._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\t",1);
          pVVar13 = (local_568->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                    .m_ptr;
          pIVar22 = (IVal *)local_530;
          pcVar12 = (pVVar13->m_name)._M_dataplus._M_p;
          local_540._0_8_ = pIVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar12,pcVar12 + (pVVar13->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,(char *)local_540._0_8_,
                     CONCAT44(local_540._12_4_,local_540._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)local_448,
                     (FloatFormat *)
                     (local_478.out0.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar27),
                     (Matrix<float,_4,_4> *)pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,_Var33._M_p,lVar20);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,4>>
                    (&local_4d0,(shaderexecutor *)local_448,(FloatFormat *)local_200,pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pSStack_380,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_380,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var33._M_p != &local_578) {
            operator_delete(_Var33._M_p,local_578._M_allocated_capacity + 1);
          }
          if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
            operator_delete((void *)local_540._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_530._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_380);
          std::ios_base::~ios_base(local_310);
        }
      }
      dVar27 = (double)((long)dVar27 + 1);
      pBVar31 = local_568;
    } while (dVar27 != local_4b0);
    iVar17 = SUB84(local_4e0,0);
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_00951085;
    }
    else {
      poVar6 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = local_558;
      std::__cxx11::ostringstream::ostringstream(poVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"(Skipped ",9);
      std::ostream::operator<<(poVar6,iVar17 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar6);
      std::ios_base::~ios_base(local_188);
    }
    poVar6 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::ostream::operator<<(poVar6,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar6);
    std::ios_base::~ios_base(local_188);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar17);
    pTVar28 = local_4d8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    local_200._0_8_ = (IVal *)local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200," test failed. Check log for the details","");
    p_Var4 = (_Base_ptr)(local_200._8_8_ + CONCAT44(local_540._12_4_,local_540._8_4_));
    p_Var30 = (_Base_ptr)0xf;
    if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
      p_Var30 = (_Base_ptr)local_530._0_8_;
    }
    if (p_Var30 < p_Var4) {
      p_Var30 = (_Base_ptr)0xf;
      if ((IVal *)local_200._0_8_ != (IVal *)local_1f0) {
        p_Var30 = local_1f0[0];
      }
      if (p_Var30 < p_Var4) goto LAB_00951076;
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_00951076:
      puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_540,local_200._0_8_);
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar23 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar23 == paVar1) {
      local_378._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_378._8_4_ = *(undefined4 *)(puVar23 + 3);
      local_378._12_4_ = *(undefined4 *)((long)puVar23 + 0x1c);
      local_388 = (undefined1  [8])&local_378;
    }
    else {
      local_378._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_388 = (undefined1  [8])*puVar23;
    }
    pSStack_380 = (Sampling<tcu::Vector<float,_4>_> *)puVar23[1];
    *puVar23 = paVar1;
    puVar23[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_388,pSStack_380 + (long)local_388);
    if (local_388 != (undefined1  [8])&local_378) {
      operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
    }
    if ((IVal *)local_200._0_8_ != (IVal *)local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)((long)&local_1f0[0]->_M_color + 1));
    }
    local_1f0[0] = (_Base_ptr)local_530._0_8_;
    pIVar22 = (IVal *)local_540._0_8_;
    if ((IVal *)local_540._0_8_ == (IVal *)local_530) goto LAB_0095125b;
  }
  operator_delete(pIVar22,(ulong)((long)&local_1f0[0]->_M_color + 1));
LAB_0095125b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4a8);
  if (local_478.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_478.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_478.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_478.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_478.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_478.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}